

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.h
# Opt level: O0

void __thiscall
Class::Class(Class *this,Group *classGroup,Subject *classSubject,Room *classRoom,
            Teacher *classTeacher,Time *classTime)

{
  undefined4 uVar1;
  Time *classTime_local;
  Teacher *classTeacher_local;
  Room *classRoom_local;
  Subject *classSubject_local;
  Group *classGroup_local;
  Class *this_local;
  
  Group::Group(&this->group,classGroup);
  Subject::Subject(&this->subject,classSubject);
  uVar1 = *(undefined4 *)&classRoom->field_0x4;
  (this->room).number = classRoom->number;
  *(undefined4 *)&(this->room).field_0x4 = uVar1;
  (this->room).capacity = classRoom->capacity;
  Teacher::Teacher(&this->teacher,classTeacher);
  Time::Time(&this->time,classTime);
  return;
}

Assistant:

Class(Group classGroup,
          Subject classSubject,
          const Room& classRoom,
          Teacher classTeacher,
          Time classTime) :
            group(move(classGroup)),
            subject(move(classSubject)),
            room(classRoom),
            teacher(move(classTeacher)),
            time(move(classTime)) {}